

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_test_pe.cc
# Opt level: O2

void Normalize(string *contents)

{
  istream *piVar1;
  long lVar2;
  string tmp;
  string local_1d8 [32];
  stringstream buffer;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer,(string *)contents,_S_out|_S_in);
  contents->_M_string_length = 0;
  *(contents->_M_dataplus)._M_p = '\0';
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&buffer,(string *)&tmp);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    lVar2 = std::__cxx11::string::find_last_not_of((char *)&tmp,0x2f000c);
    if (lVar2 == -1) {
      tmp._M_string_length = 0;
      *tmp._M_dataplus._M_p = '\0';
    }
    else {
      std::__cxx11::string::substr((ulong)local_1d8,(ulong)&tmp);
      std::__cxx11::string::operator=((string *)&tmp,local_1d8);
      std::__cxx11::string::~string(local_1d8);
    }
    if (contents->_M_string_length != 0) {
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::append((string *)contents);
  }
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return;
}

Assistant:

void Normalize(std::string& contents) {
  std::stringstream buffer(contents);
  contents.clear();
  std::string tmp;
  while (std::getline(buffer, tmp)) {
    auto end = tmp.find_last_not_of("\t \r");
    if (end != std::string::npos) {
      tmp = tmp.substr(0, end + 1);
    }
    else {
      tmp.clear();
    }
    if (!contents.empty()) {
      contents += "\n";
    }
    contents += tmp;
  }
}